

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool google::protobuf::compiler::js::anon_unknown_0::HasRepeatedFields
               (GeneratorOptions *options,Descriptor *desc)

{
  int iVar1;
  size_type sVar2;
  once_flag *__once;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  iVar1 = *(int *)((long)&(options->library).field_2 + 8);
  bVar5 = 0 < iVar1;
  if (0 < iVar1) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      sVar2 = (options->namespace_prefix)._M_string_length;
      if (*(int *)(sVar2 + 0x3c + lVar6) == 3) {
        __once = *(once_flag **)(sVar2 + 0x30 + lVar6);
        if (__once != (once_flag *)0x0) {
          local_38 = FieldDescriptor::TypeOnceInit;
          local_40 = (FieldDescriptor *)(sVar2 + lVar6);
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (__once,&local_38,&local_40);
        }
        if (*(int *)(sVar2 + 0x38 + lVar6) != 0xb) {
          return bVar5;
        }
        bVar3 = FieldDescriptor::is_map_message_type((FieldDescriptor *)(sVar2 + lVar6));
        if (!bVar3) {
          return bVar5;
        }
      }
      lVar7 = lVar7 + 1;
      lVar4 = (long)*(int *)((long)&(options->library).field_2 + 8);
      lVar6 = lVar6 + 0x98;
      bVar5 = lVar7 < lVar4;
    } while (lVar7 < lVar4);
  }
  return bVar5;
}

Assistant:

bool HasRepeatedFields(const GeneratorOptions& options,
                       const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); i++) {
    if (desc->field(i)->is_repeated() && !desc->field(i)->is_map()) {
      return true;
    }
  }
  return false;
}